

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdySparseMAPSolver.cpp
# Opt level: O0

void __thiscall
iDynTree::BerdySparseMAPSolver::updateEstimateInformationFloatingBase
          (BerdySparseMAPSolver *this,JointPosDoubleArray *jointsConfiguration,
          JointDOFsDoubleArray *jointsVelocity,FrameIndex floatingFrame,
          Vector3 *bodyAngularVelocityOfSpecifiedFrame,VectorDynSize *measurements)

{
  JointPosDoubleArray *in_RDI;
  JointPosDoubleArray *in_R9;
  Vector3 *in_stack_000001d8;
  FrameIndex *in_stack_000001e0;
  JointDOFsDoubleArray *in_stack_000001e8;
  JointPosDoubleArray *in_stack_000001f0;
  BerdyHelper *in_stack_000001f8;
  
  JointPosDoubleArray::operator=(in_R9,in_RDI);
  JointDOFsDoubleArray::operator=((JointDOFsDoubleArray *)in_R9,(JointDOFsDoubleArray *)in_RDI);
  iDynTree::VectorDynSize::operator=
            ((VectorDynSize *)(*(long *)in_RDI + 0x2b8),(VectorDynSize *)in_R9);
  BerdyHelper::updateKinematicsFromFloatingBase
            (in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,
             in_stack_000001d8);
  return;
}

Assistant:

void BerdySparseMAPSolver::updateEstimateInformationFloatingBase(const iDynTree::JointPosDoubleArray& jointsConfiguration,
                                                                     const iDynTree::JointDOFsDoubleArray& jointsVelocity,
                                                                     const FrameIndex floatingFrame,
                                                                     const Vector3& bodyAngularVelocityOfSpecifiedFrame,
                                                                     const iDynTree::VectorDynSize& measurements)
    {
        assert(m_pimpl);

        m_pimpl->jointsConfiguration = jointsConfiguration;
        m_pimpl->jointsVelocity = jointsVelocity;
        m_pimpl->measurements = measurements;

        m_pimpl->berdy.updateKinematicsFromFloatingBase(m_pimpl->jointsConfiguration, m_pimpl->jointsVelocity,
                                                        floatingFrame, bodyAngularVelocityOfSpecifiedFrame);
    }